

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

QHash<QByteArray,_QByteArray>
QAuthenticatorPrivate::parseDigestAuthenticationChallenge(QByteArrayView challenge)

{
  byte bVar1;
  byte bVar2;
  Entry *pEVar3;
  QStringTokenizerBaseBase QVar4;
  undefined1 *puVar5;
  char *pcVar6;
  char cVar7;
  QHash<QByteArray,_QByteArray> QVar8;
  ulong uVar9;
  byte *in_RDX;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  long in_FS_OFFSET;
  QLatin1String QVar13;
  QLatin1String QVar14;
  iterator __begin1;
  QByteArray local_b8;
  QHash<QByteArray,_QByteArray> local_a0;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0.d = (Data *)0x0;
  if (0 < (long)challenge.m_data) {
    pbVar12 = (byte *)(challenge.m_data + (long)in_RDX);
LAB_001a3c56:
    do {
      pbVar10 = in_RDX;
      if (((ulong)*in_RDX < 0x21) && ((0x100002400U >> ((ulong)*in_RDX & 0x3f) & 1) != 0)) {
        in_RDX = in_RDX + 1;
        pbVar10 = in_RDX;
        if (in_RDX < pbVar12) goto LAB_001a3c56;
      }
      for (; (in_RDX < pbVar12 && (*in_RDX != 0x3d)); in_RDX = in_RDX + 1) {
      }
      if (pbVar12 <= in_RDX + 1) break;
      bVar1 = in_RDX[1];
      pbVar11 = in_RDX + 1;
      if (bVar1 == 0x22) {
        pbVar11 = in_RDX + 2;
      }
      if (pbVar12 <= pbVar11) break;
      local_58.super_QStringTokenizerBaseBase.m_sb.
      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
      local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
      local_58.m_haystack.m_size = 0;
      local_58.m_haystack.m_data = (char *)0x0;
      do {
        bVar2 = *pbVar11;
        if (pbVar11 >= pbVar12 + -1 || bVar2 != 0x5c) {
          if (bVar1 == 0x22) {
            if (bVar2 == 0x22) break;
          }
          else if (bVar2 == 0x2c) break;
        }
        QByteArray::append((char)&local_58);
        pbVar11 = pbVar11 + (ulong)(pbVar11 < pbVar12 + -1 && bVar2 == 0x5c) + 1;
      } while (pbVar11 < pbVar12);
      for (; (pbVar11 < pbVar12 && (*pbVar11 != 0x2c)); pbVar11 = pbVar11 + 1) {
      }
      QByteArray::QByteArray(&local_b8,(char *)pbVar10,(long)in_RDX - (long)pbVar10);
      QHash<QByteArray,QByteArray>::tryEmplace_impl<QByteArray_const&>
                ((TryEmplaceResult *)local_98,(QHash<QByteArray,QByteArray> *)&local_a0,&local_b8);
      pEVar3 = (*(Span **)(local_98._0_8_ + 0x20))[(ulong)local_98._8_8_ >> 7].entries;
      uVar9 = (ulong)((uint)(*(Span **)(local_98._0_8_ + 0x20))[(ulong)local_98._8_8_ >> 7].offsets
                            [(uint)local_98._8_8_ & 0x7f] * 0x30);
      QVar4 = *(QStringTokenizerBaseBase *)((pEVar3->storage).data + uVar9 + 0x18);
      *(QStringTokenizerBaseBase *)((pEVar3->storage).data + uVar9 + 0x18) =
           local_58.super_QStringTokenizerBaseBase;
      puVar5 = *(undefined1 **)((pEVar3->storage).data + uVar9 + 0x20);
      *(qsizetype *)((pEVar3->storage).data + uVar9 + 0x20) = local_58.m_haystack.m_size;
      pcVar6 = *(char **)((pEVar3->storage).data + uVar9 + 0x28);
      *(char **)((pEVar3->storage).data + uVar9 + 0x28) = local_58.m_haystack.m_data;
      local_58.super_QStringTokenizerBaseBase = QVar4;
      local_58.m_haystack.m_size = (qsizetype)puVar5;
      local_58.m_haystack.m_data = pcVar6;
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
        LOCK();
        *(int *)local_58.super_QStringTokenizerBaseBase =
             *(int *)local_58.super_QStringTokenizerBaseBase + -1;
        UNLOCK();
        if (*(int *)local_58.super_QStringTokenizerBaseBase == 0) {
          QArrayData::deallocate((QArrayData *)local_58.super_QStringTokenizerBaseBase,1,0x10);
        }
      }
      in_RDX = pbVar11 + 1;
    } while (in_RDX < pbVar12);
  }
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)local_98,"qop",-1);
  QHash<QByteArray,_QByteArray>::value(&local_b8,&local_a0,(QByteArray *)local_98);
  if ((Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_98._0_8_ !=
      (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,1,0x10);
    }
  }
  if ((undefined1 *)local_b8.d.size == (undefined1 *)0x0) {
LAB_001a3fb8:
    QVar8.d = local_a0.d;
    local_a0.d = (Data *)0x0;
  }
  else {
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_58.m_haystack.m_size = local_b8.d.size;
    local_58.m_haystack.m_data = local_b8.d.ptr;
    local_58.m_needle.ucs = L',';
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)local_98,&local_58);
    if (local_98[0x18] == true) {
      do {
        if (((undefined1 *)local_98._8_8_ == &DAT_00000004) &&
           (QVar13.m_data = (char *)local_98._16_8_, QVar13.m_size = 4, QVar14.m_data = "auth",
           QVar14.m_size = 4, cVar7 = QtPrivate::equalStrings(QVar13,QVar14), cVar7 != '\0')) {
          QByteArray::QByteArray((QByteArray *)&local_58,"qop",-1);
          QHash<QByteArray,QByteArray>::tryEmplace_impl<QByteArray_const&>
                    ((TryEmplaceResult *)local_98,(QHash<QByteArray,QByteArray> *)&local_a0,
                     (QByteArray *)&local_58);
          QByteArray::operator=
                    ((QByteArray *)
                     ((((*(Span **)(local_98._0_8_ + 0x20))[(ulong)local_98._8_8_ >> 7].entries)->
                      storage).data +
                     (ulong)((uint)(*(Span **)(local_98._0_8_ + 0x20))[(ulong)local_98._8_8_ >> 7].
                                   offsets[(uint)local_98._8_8_ & 0x7f] * 0x30) + 0x18),"auth");
          if (local_58.super_QStringTokenizerBaseBase != (QStringTokenizerBaseBase)0x0) {
            LOCK();
            *(int *)local_58.super_QStringTokenizerBaseBase =
                 *(int *)local_58.super_QStringTokenizerBaseBase + -1;
            UNLOCK();
            if (*(int *)local_58.super_QStringTokenizerBaseBase == 0) {
              QArrayData::deallocate((QArrayData *)local_58.super_QStringTokenizerBaseBase,1,0x10);
            }
          }
          goto LAB_001a3fb8;
        }
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_98);
      } while (local_98[0x18] != false);
    }
    QVar8.d = (Data *)0x0;
  }
  *(Data **)challenge.m_size = QVar8.d;
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
    }
  }
  QHash<QByteArray,_QByteArray>::~QHash(&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QHash<QByteArray,_QByteArray>)(Data *)challenge.m_size;
}

Assistant:

QHash<QByteArray, QByteArray>
QAuthenticatorPrivate::parseDigestAuthenticationChallenge(QByteArrayView challenge)
{
    QHash<QByteArray, QByteArray> options;
    // parse the challenge
    const char *d = challenge.data();
    const char *end = d + challenge.size();
    while (d < end) {
        while (d < end && (*d == ' ' || *d == '\n' || *d == '\r'))
            ++d;
        const char *start = d;
        while (d < end && *d != '=')
            ++d;
        QByteArrayView key = QByteArrayView(start, d - start);
        ++d;
        if (d >= end)
            break;
        bool quote = (*d == '"');
        if (quote)
            ++d;
        if (d >= end)
            break;
        QByteArray value;
        while (d < end) {
            bool backslash = false;
            if (*d == '\\' && d < end - 1) {
                ++d;
                backslash = true;
            }
            if (!backslash) {
                if (quote) {
                    if (*d == '"')
                        break;
                } else {
                    if (*d == ',')
                        break;
                }
            }
            value += *d;
            ++d;
        }
        while (d < end && *d != ',')
            ++d;
        ++d;
        options[key.toByteArray()] = std::move(value);
    }

    QByteArray qop = options.value("qop");
    if (!qop.isEmpty()) {
        if (!containsAuth(qop))
            return QHash<QByteArray, QByteArray>();
        // #### can't do auth-int currently
//         if (qop.contains("auth-int"))
//             qop = "auth-int";
//         else if (qop.contains("auth"))
//             qop = "auth";
//         else
//             qop = QByteArray();
        options["qop"] = "auth";
    }

    return options;
}